

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe.cc
# Opt level: O0

void bloaty::pe::ParseSections(PeFile *pe,RangeSink *sink)

{
  bool bVar1;
  PeFile *in_RDI;
  anon_class_16_2_e872f01b *in_stack_00000048;
  PeFile *in_stack_00000050;
  
  bVar1 = PeFile::IsOpen(in_RDI);
  if (!bVar1) {
    __assert_fail("pe.IsOpen()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/pe.cc",0xc0
                  ,"void bloaty::pe::ParseSections(const PeFile &, RangeSink *)");
  }
  ForEachSection<bloaty::pe::ParseSections(bloaty::pe::PeFile_const&,bloaty::RangeSink*)::__0>
            (in_stack_00000050,in_stack_00000048);
  return;
}

Assistant:

void ParseSections(const PeFile& pe, RangeSink* sink) {
  assert(pe.IsOpen());
  ForEachSection(pe, [sink, &pe](const Section& section) {
    uint64_t vmaddr = section.virtual_addr();
    uint64_t vmsize = section.virtual_size();
    std::string_view section_data = StrictSubstr(
        pe.entire_file(), section.raw_offset(), section.raw_size());

    sink->AddRange("pe_sections", section.name, vmaddr, vmsize, section_data);
  });
}